

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O2

int Abc_NodeRefDeref(Abc_Obj_t *pNode,int fReference,int fLabel)

{
  int iVar1;
  int *piVar2;
  void **ppvVar3;
  Abc_Obj_t *pNode_00;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  iVar6 = 0;
  while( true ) {
    bVar8 = fReference == 0;
    iVar7 = 0;
    while( true ) {
      if (fLabel != 0) {
        Abc_NodeSetTravIdCurrent(pNode);
      }
      uVar5 = *(uint *)&pNode->field_0x14 & 0xf;
      iVar4 = 0;
      if ((uVar5 == 2) || (uVar5 == 5)) goto LAB_00686557;
      piVar2 = (pNode->vFanins).pArray;
      ppvVar3 = pNode->pNtk->vObjs->pArray;
      pNode_00 = (Abc_Obj_t *)ppvVar3[*piVar2];
      pNode = (Abc_Obj_t *)ppvVar3[piVar2[1]];
      iVar1 = (pNode_00->vFanouts).nSize;
      iVar4 = 1;
      if (bVar8) break;
      (pNode_00->vFanouts).nSize = iVar1 + 1;
      if (iVar1 == 0) {
        iVar4 = Abc_NodeRefDeref(pNode_00,1,fLabel);
        iVar4 = iVar4 + 1;
      }
      iVar1 = (pNode->vFanouts).nSize;
      (pNode->vFanouts).nSize = iVar1 + 1;
      if (iVar1 != 0) goto LAB_00686557;
      iVar7 = iVar7 + iVar4;
      bVar8 = false;
    }
    if (iVar1 < 1) {
      __assert_fail("pNode0->vFanouts.nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                    ,0x95,"int Abc_NodeRefDeref(Abc_Obj_t *, int, int)");
    }
    if ((pNode->vFanouts).nSize < 1) {
      __assert_fail("pNode1->vFanouts.nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                    ,0x96,"int Abc_NodeRefDeref(Abc_Obj_t *, int, int)");
    }
    (pNode_00->vFanouts).nSize = iVar1 + -1;
    if (iVar1 + -1 == 0) {
      iVar4 = Abc_NodeRefDeref(pNode_00,0,fLabel);
      iVar4 = iVar4 + 1;
    }
    piVar2 = &(pNode->vFanouts).nSize;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 != 0) break;
    iVar6 = iVar6 + iVar4 + iVar7;
    fReference = 0;
  }
LAB_00686557:
  return iVar7 + iVar6 + iVar4;
}

Assistant:

int Abc_NodeRefDeref( Abc_Obj_t * pNode, int fReference, int fLabel )
{
    Abc_Obj_t * pNode0, * pNode1;
    int Counter;
    // label visited nodes
    if ( fLabel )
        Abc_NodeSetTravIdCurrent( pNode );
    // skip the CI
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    // process the internal node
    pNode0 = Abc_ObjFanin0(pNode);
    pNode1 = Abc_ObjFanin1(pNode);
    Counter = 1;
    if ( fReference )
    {
        if ( pNode0->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDeref( pNode0, fReference, fLabel );
        if ( pNode1->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDeref( pNode1, fReference, fLabel );
    }
    else
    {
        assert( pNode0->vFanouts.nSize > 0 );
        assert( pNode1->vFanouts.nSize > 0 );
        if ( --pNode0->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDeref( pNode0, fReference, fLabel );
        if ( --pNode1->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDeref( pNode1, fReference, fLabel );
    }
    return Counter;
}